

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O3

void __thiscall
QPlatformTextureListWatcher::onLockStatusChanged(QPlatformTextureListWatcher *this,bool locked)

{
  bool bVar1;
  long in_FS_OFFSET;
  QPlatformTextureList *tl;
  QPlatformTextureList *local_40;
  TryEmplaceResult local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (QPlatformTextureList *)QObject::sender();
  QHash<QPlatformTextureList*,bool>::tryEmplace_impl<QPlatformTextureList*const&>
            (&local_38,this + 0x10,&local_40);
  (local_38.iterator.i.d)->spans[local_38.iterator.i.bucket >> 7].entries
  [(local_38.iterator.i.d)->spans[local_38.iterator.i.bucket >> 7].offsets
   [(uint)local_38.iterator.i.bucket & 0x7f]].storage.data[8] = locked;
  bVar1 = isLocked(this);
  if (!bVar1) {
    QWidgetRepaintManager::sync(*(QWidgetRepaintManager **)(this + 0x18));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void onLockStatusChanged(bool locked) {
        QPlatformTextureList *tl = static_cast<QPlatformTextureList *>(sender());
        m_locked[tl] = locked;
        if (!isLocked())
            m_repaintManager->sync();
     }